

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorProto::Clear(DescriptorProto *this)

{
  bool bVar1;
  UnknownFieldSet *this_00;
  DescriptorProto *this_local;
  
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if ((bVar1) && (this->name_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
    bVar1 = has_options(this);
    if ((bVar1) && (this->options_ != (MessageOptions *)0x0)) {
      MessageOptions::Clear(this->options_);
    }
  }
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear(&this->field_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear(&this->extension_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::Clear(&this->nested_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Clear(&this->enum_type_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Clear(&this->extension_range_)
  ;
  memset(this->_has_bits_,0,4);
  this_00 = mutable_unknown_fields(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void DescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::MessageOptions::Clear();
    }
  }
  field_.Clear();
  extension_.Clear();
  nested_type_.Clear();
  enum_type_.Clear();
  extension_range_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}